

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.cpp
# Opt level: O0

vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
* __thiscall
Graph::Gotlieb(vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *__return_storage_ptr__,Graph *this,int r,int *m,
              vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
              *adjMatrix)

{
  allocator<int> *this_00;
  allocator<std::vector<int,_std::allocator<int>_>_> *this_01;
  value_type vVar1;
  bool bVar2;
  int iVar3;
  reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  ostream *poVar7;
  size_type sVar8;
  bool bVar9;
  reference rVar10;
  bool local_209;
  reference local_1a0;
  int local_190;
  allocator<std::vector<int,_std::allocator<int>_>_> local_18a;
  undefined1 local_189;
  int i_1;
  int *count;
  vector<bool,_std::allocator<bool>_> *adjMatrix_i;
  vector<int,_std::allocator<int>_> *treeAdjMat_i;
  _Bit_type local_168;
  reference local_160;
  reference local_150;
  allocator<std::vector<int,_std::allocator<int>_>_> local_13a;
  allocator<int> local_139;
  vector<int,_std::allocator<int>_> local_138;
  undefined1 local_120 [8];
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  dmat;
  int n_1;
  bool found;
  _Bit_type local_f8;
  allocator<std::vector<int,_std::allocator<int>_>_> local_ea;
  allocator<int> local_e9;
  vector<int,_std::allocator<int>_> local_e8;
  undefined1 local_d0 [8];
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  copytreeAdjMat;
  vector<int,_std::allocator<int>_> local_b0;
  undefined1 local_98 [8];
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  treeAdjMat;
  allocator<int> local_6d;
  value_type_conflict local_6c;
  undefined1 local_68 [8];
  vector<int,_std::allocator<int>_> x;
  int n;
  int f;
  int done;
  int nu;
  int c;
  int k;
  int j;
  int i;
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  *adjMatrix_local;
  int *m_local;
  int r_local;
  Graph *this_local;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *indm;
  
  *m = 0;
  local_6c = 0;
  std::allocator<int>::allocator(&local_6d);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_68,(long)r,&local_6c,&local_6d);
  std::allocator<int>::~allocator(&local_6d);
  this_00 = (allocator<int> *)
            ((long)&copytreeAdjMat.
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(this_00);
  std::vector<int,_std::allocator<int>_>::vector(&local_b0,(long)r,this_00);
  this_01 = (allocator<std::vector<int,_std::allocator<int>_>_> *)
            ((long)&copytreeAdjMat.
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 6);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::allocator(this_01);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)local_98,(long)r,&local_b0,this_01);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::~allocator
            ((allocator<std::vector<int,_std::allocator<int>_>_> *)
             ((long)&copytreeAdjMat.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
  std::vector<int,_std::allocator<int>_>::~vector(&local_b0);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&copytreeAdjMat.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<int>::allocator(&local_e9);
  std::vector<int,_std::allocator<int>_>::vector(&local_e8,(long)r,&local_e9);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::allocator(&local_ea);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)local_d0,(long)r,&local_e8,&local_ea);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::~allocator(&local_ea);
  std::vector<int,_std::allocator<int>_>::~vector(&local_e8);
  std::allocator<int>::~allocator(&local_e9);
  for (k = 0; k < r; k = k + 1) {
    bVar9 = false;
    for (c = k; c < r; c = c + 1) {
      pvVar4 = std::
               vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
               ::operator[](adjMatrix,(long)k);
      rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[](pvVar4,(long)c);
      _n_1 = rVar10;
      local_209 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&n_1);
      local_209 = local_209 && !bVar9;
      if (local_209) {
        pvVar5 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               *)local_98,(long)k);
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](pvVar5,(long)c);
        *pvVar6 = 1;
        pvVar5 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               *)local_98,(long)c);
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](pvVar5,(long)k);
        *pvVar6 = 1;
        bVar9 = true;
      }
    }
  }
  for (k = 0; k < r; k = k + 1) {
    for (c = 0; c < r; c = c + 1) {
      if (r <= k) {
        __assert_fail("i < r",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/leannejdong[P]circuitdebug/algorithm.cpp"
                      ,0x58,"vector<vector<int>> Graph::Gotlieb(int, int *, vector<vector<bool>> &)"
                     );
      }
      pvVar5 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             *)local_98,(long)k);
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](pvVar5,(long)c);
      vVar1 = *pvVar6;
      pvVar5 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             *)local_d0,(long)k);
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](pvVar5,(long)c);
      *pvVar6 = vVar1;
    }
  }
  poVar7 = (ostream *)std::ostream::operator<<(&std::cout,r);
  std::operator<<(poVar7,"\n");
  for (k = 0; k < r; k = k + 1) {
    for (c = 0; c < r; c = c + 1) {
      pvVar5 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             *)local_d0,(long)k);
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](pvVar5,(long)c);
      if (*pvVar6 == 1) {
        for (nu = 0; nu < r; nu = nu + 1) {
          pvVar5 = std::
                   vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 *)local_d0,(long)c);
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](pvVar5,(long)nu);
          if (*pvVar6 == 1) {
            pvVar5 = std::
                     vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   *)local_d0,(long)c);
            pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](pvVar5,(long)nu);
            vVar1 = *pvVar6;
            pvVar5 = std::
                     vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   *)local_d0,(long)k);
            pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](pvVar5,(long)nu);
            *pvVar6 = vVar1;
            pvVar5 = std::
                     vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   *)local_d0,(long)c);
            pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](pvVar5,(long)nu);
            iVar3 = *pvVar6;
            pvVar5 = std::
                     vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   *)local_d0,(long)c);
            pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](pvVar5,(long)nu);
            *pvVar6 = -iVar3;
          }
        }
      }
    }
  }
  for (c = 0; c < r; c = c + 1) {
    dmat.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
    for (k = 0; k < r; k = k + 1) {
      pvVar5 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             *)local_d0,(long)k);
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](pvVar5,(long)c);
      if ((*pvVar6 == 1) &&
         ((dmat.
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0)) {
        nu = k;
        dmat.
        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
      }
      else {
        pvVar5 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               *)local_d0,(long)k);
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](pvVar5,(long)c);
        if ((*pvVar6 == 1) &&
           ((dmat.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0)) {
          for (dmat.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
              (int)dmat.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage < r;
              dmat.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
                   (int)dmat.
                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) {
            pvVar5 = std::
                     vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   *)local_d0,(long)k);
            pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                               (pvVar5,(long)(int)dmat.
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                               );
            if (*pvVar6 == 1) {
              pvVar5 = std::
                       vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                     *)local_d0,(long)k);
              pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                                 (pvVar5,(long)(int)dmat.
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                 );
              vVar1 = *pvVar6;
              pvVar5 = std::
                       vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                     *)local_d0,(long)nu);
              pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                                 (pvVar5,(long)(int)dmat.
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                 );
              *pvVar6 = vVar1;
              pvVar5 = std::
                       vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                     *)local_d0,(long)k);
              pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                                 (pvVar5,(long)(int)dmat.
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                 );
              iVar3 = *pvVar6;
              pvVar5 = std::
                       vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                     *)local_d0,(long)k);
              pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                                 (pvVar5,(long)(int)dmat.
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                 );
              *pvVar6 = -iVar3;
            }
          }
        }
      }
    }
  }
  x.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage.
  _0_4_ = 0;
  k = 0;
  do {
    if (r <= k) {
      sVar8 = (size_type)
              (int)x.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_end_of_storage;
      std::allocator<int>::allocator(&local_139);
      std::vector<int,_std::allocator<int>_>::vector(&local_138,(long)r,&local_139);
      std::allocator<std::vector<int,_std::allocator<int>_>_>::allocator(&local_13a);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)local_120,sVar8,&local_138,&local_13a);
      std::allocator<std::vector<int,_std::allocator<int>_>_>::~allocator(&local_13a);
      std::vector<int,_std::allocator<int>_>::~vector(&local_138);
      std::allocator<int>::~allocator(&local_139);
      nu = 0;
      k = 0;
      do {
        if (r <= k) {
          c = 0;
          do {
            if (r <= c) {
              x.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage._4_4_ = 0;
              for (k = 0; k < (int)x.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage; k = k + 1) {
                for (c = 0; c < r; c = c + 1) {
                  pvVar5 = std::
                           vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                         *)local_120,(long)k);
                  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](pvVar5,(long)c);
                  if (*pvVar6 == 1) {
                    for (nu = 0; nu < r; nu = nu + 1) {
                      pvVar4 = std::
                               vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                               ::operator[](adjMatrix,(long)nu);
                      rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[](pvVar4,(long)c);
                      local_150 = rVar10;
                      bVar2 = std::_Bit_reference::operator_cast_to_bool(&local_150);
                      bVar9 = false;
                      if (bVar2) {
                        pvVar5 = std::
                                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                               *)local_120,(long)k);
                        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](pvVar5,(long)nu)
                        ;
                        bVar9 = false;
                        if (*pvVar6 == 0) {
                          bVar9 = x.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage._4_4_ == 0;
                        }
                      }
                      if (bVar9) {
                        pvVar4 = std::
                                 vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                                 ::operator[](adjMatrix,(long)nu);
                        rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                           (pvVar4,(long)c);
                        local_160 = rVar10;
                        std::_Bit_reference::operator=(&local_160,true);
                        pvVar4 = std::
                                 vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                                 ::operator[](adjMatrix,(long)c);
                        rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                           (pvVar4,(long)nu);
                        local_168 = rVar10._M_mask;
                        treeAdjMat_i = (vector<int,_std::allocator<int>_> *)rVar10._M_p;
                        std::_Bit_reference::operator=((_Bit_reference *)&treeAdjMat_i,true);
                        x.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
                      }
                    }
                  }
                }
              }
              k = 0;
              while( true ) {
                if (r <= k) {
                  *m = *m / 2;
                  iVar3 = r * *m + 1 + *m;
                  local_189 = 0;
                  _i_1 = m;
                  std::allocator<std::vector<int,_std::allocator<int>_>_>::allocator(&local_18a);
                  std::
                  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ::vector(__return_storage_ptr__,(long)r,&local_18a);
                  std::allocator<std::vector<int,_std::allocator<int>_>_>::~allocator(&local_18a);
                  for (local_190 = 0; local_190 < r; local_190 = local_190 + 1) {
                    pvVar5 = std::
                             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             ::operator[](__return_storage_ptr__,(long)local_190);
                    std::vector<int,_std::allocator<int>_>::resize(pvVar5,(long)iVar3);
                  }
                  for (c = 0; c < iVar3 - r; c = c + r + 1) {
                    for (k = 0; k < r; k = k + 1) {
                      pvVar5 = std::
                               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               ::operator[](__return_storage_ptr__,(long)k);
                      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](pvVar5,(long)c);
                      *pvVar6 = -4;
                    }
                  }
                  for (k = 0; k < r; k = k + 1) {
                    pvVar5 = std::
                             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             ::operator[](__return_storage_ptr__,(long)k);
                    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                                       (pvVar5,(long)(iVar3 + -1));
                    *pvVar6 = -5;
                  }
                  for (nu = 1; nu < iVar3; nu = nu + r + 1) {
                    for (k = 0; k < r; k = k + 1) {
                      for (c = 0; c < r; c = c + 1) {
                        pvVar5 = std::
                                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                               *)local_98,(long)k);
                        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](pvVar5,(long)c);
                        vVar1 = *pvVar6;
                        pvVar5 = std::
                                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 ::operator[](__return_storage_ptr__,(long)k);
                        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                                           (pvVar5,(long)(c + nu));
                        *pvVar6 = vVar1;
                      }
                    }
                  }
                  nu = 1;
                  for (k = 0; c = k, k < r; k = k + 1) {
                    while (c = c + 1, c < r) {
                      pvVar4 = std::
                               vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                               ::operator[](adjMatrix,(long)k);
                      rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[](pvVar4,(long)c);
                      local_1a0 = rVar10;
                      bVar2 = std::_Bit_reference::operator_cast_to_bool(&local_1a0);
                      bVar9 = false;
                      if (bVar2) {
                        pvVar5 = std::
                                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                               *)local_98,(long)k);
                        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](pvVar5,(long)c);
                        bVar9 = *pvVar6 == 0;
                      }
                      if (bVar9) {
                        pvVar5 = std::
                                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 ::operator[](__return_storage_ptr__,(long)k);
                        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                                           (pvVar5,(long)(c + nu));
                        *pvVar6 = 1;
                        pvVar5 = std::
                                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 ::operator[](__return_storage_ptr__,(long)c);
                        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                                           (pvVar5,(long)(k + nu));
                        *pvVar6 = 1;
                        nu = nu + r + 1;
                      }
                    }
                  }
                  for (nu = 1; bVar9 = false, nu < iVar3; nu = nu + r + 1) {
                    while (!bVar9) {
                      bVar9 = true;
                      for (k = 0; f = 0, k < r; k = k + 1) {
                        for (c = 0; c < r; c = c + 1) {
                          pvVar5 = std::
                                   vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   ::operator[](__return_storage_ptr__,(long)k);
                          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                                             (pvVar5,(long)(c + nu));
                          if (*pvVar6 == 1) {
                            f = f + 1;
                          }
                        }
                        if (f == 1) {
                          for (c = 0; c < r; c = c + 1) {
                            pvVar5 = std::
                                     vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                     ::operator[](__return_storage_ptr__,(long)k);
                            pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                                               (pvVar5,(long)(c + nu));
                            if (*pvVar6 == 1) {
                              pvVar5 = std::
                                       vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                       ::operator[](__return_storage_ptr__,(long)k);
                              pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                                                 (pvVar5,(long)(c + nu));
                              *pvVar6 = 0;
                              pvVar5 = std::
                                       vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                       ::operator[](__return_storage_ptr__,(long)c);
                              pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                                                 (pvVar5,(long)(k + nu));
                              *pvVar6 = 0;
                              bVar9 = false;
                            }
                          }
                        }
                      }
                    }
                  }
                  local_189 = 1;
                  std::
                  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             *)local_120);
                  std::
                  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             *)local_d0);
                  std::
                  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             *)local_98);
                  std::vector<int,_std::allocator<int>_>::~vector
                            ((vector<int,_std::allocator<int>_> *)local_68);
                  return __return_storage_ptr__;
                }
                adjMatrix_i = (vector<bool,_std::allocator<bool>_> *)
                              std::
                              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                              ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                            *)local_98,(long)k);
                count = (int *)std::
                               vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                               ::operator[](adjMatrix,(long)k);
                sVar8 = std::vector<int,_std::allocator<int>_>::size
                                  ((vector<int,_std::allocator<int>_> *)adjMatrix_i);
                if ((long)r != sVar8) break;
                iVar3 = countDifference<std::vector<int,std::allocator<int>>,std::vector<bool,std::allocator<bool>>>
                                  (this,(vector<int,_std::allocator<int>_> *)adjMatrix_i,
                                   (vector<bool,_std::allocator<bool>_> *)count);
                *m = iVar3 + *m;
                k = k + 1;
              }
              __assert_fail("static_cast<size_t>(r)==treeAdjMat_i.size()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/leannejdong[P]circuitdebug/algorithm.cpp"
                            ,200,
                            "vector<vector<int>> Graph::Gotlieb(int, int *, vector<vector<bool>> &)"
                           );
            }
            for (k = 0; k < (int)x.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage; k = k + 1) {
              if ((int)x.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage <= k) {
                __assert_fail("i<n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/leannejdong[P]circuitdebug/algorithm.cpp"
                              ,0xa8,
                              "vector<vector<int>> Graph::Gotlieb(int, int *, vector<vector<bool>> &)"
                             );
              }
              pvVar5 = std::
                       vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                     *)local_120,(long)k);
              pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](pvVar5,(long)c);
              if (*pvVar6 != 1) {
                pvVar5 = std::
                         vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                       *)local_120,(long)k);
                pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](pvVar5,(long)c);
                if ((*pvVar6 == 0) &&
                   (c == (int)x.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage + -1)) {
                  printf("\nError in block 2 while searching for independent meshes\n");
                }
              }
            }
            c = c + 1;
          } while( true );
        }
        c = 0;
        while( true ) {
          if (r <= c) goto LAB_00103dbf;
          pvVar5 = std::
                   vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 *)local_d0,(long)k);
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](pvVar5,(long)c);
          if (*pvVar6 == 1) break;
          c = c + 1;
        }
        for (x.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage._4_4_ = 0;
            x.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage._4_4_ < r;
            x.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage._4_4_ =
                 x.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_end_of_storage._4_4_ + 1) {
          pvVar5 = std::
                   vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 *)local_d0,(long)k);
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             (pvVar5,(long)x.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                           super__Vector_impl_data._M_end_of_storage._4_4_);
          vVar1 = *pvVar6;
          pvVar5 = std::
                   vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 *)local_120,(long)nu);
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             (pvVar5,(long)x.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                           super__Vector_impl_data._M_end_of_storage._4_4_);
          *pvVar6 = vVar1;
        }
        nu = nu + 1;
LAB_00103dbf:
        k = k + 1;
      } while( true );
    }
    for (c = 0; c < r; c = c + 1) {
      pvVar5 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             *)local_d0,(long)k);
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](pvVar5,(long)c);
      if (*pvVar6 == 1) {
        x.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._0_4_ =
             (int)x.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_end_of_storage + 1;
        break;
      }
    }
    k = k + 1;
  } while( true );
}

Assistant:

vector<vector<int>> Gotlieb(int r, int *m, vector<vector<bool>>& adjMatrix)
    {
        *m = 0; int i, j, k, c, nu, done, f, n;
        vector<int> x(r, 0);
        //Block 1
        vector<vector<int>> treeAdjMat(r, vector<int>(r));
        vector<vector<int>> copytreeAdjMat(r, vector<int>(r));
        for (i=0; i < r; i++)
        {
            done = 0;
            for (j=i; j < r; j++)
            {
                if(adjMatrix[i][j]==1 && done==0){
                    treeAdjMat[i][j]=1;
                    treeAdjMat[j][i]=1;
                    done=1;
                }
            }
        }
        //Block 2
        for(i=0; i<r; i++)
        {
            for(j=0; j<r; j++)
            {
                assert(i < r);
                copytreeAdjMat[i][j]=treeAdjMat[i][j];
            }
        }
        cout << r << "\n";

        for(i=0; i<r; i++)
        {
            for(j=0; j<r; j++)
            {
                if(copytreeAdjMat[i][j]==1)
                {
                    for(k=0; k<r; k++)
                        if(copytreeAdjMat[j][k]==1){
                            copytreeAdjMat[i][k]=copytreeAdjMat[j][k];
                            copytreeAdjMat[j][k]=-copytreeAdjMat[j][k];
                        }
                }
            }
        }

        // now join together the strands that are part of a single cord
        for(j=0; j<r; j++){
            bool found = false;
            for(i=0; i<r; i++)
            {
                if(copytreeAdjMat[i][j]==1 && !found)
                {
                    k=i;
                    found=true;
                }
                else if(copytreeAdjMat[i][j]==1 && found){
                    for(int n=0; n<r; n++)
                        if(copytreeAdjMat[i][n]==1)
                        {
                            copytreeAdjMat[k][n]=copytreeAdjMat[i][n];
                            copytreeAdjMat[i][n]=-copytreeAdjMat[i][n];
                        }
                }
            }
        }

        //count how many lines the matrix c has
        n=0;
        for(i=0;i<r; i++)
        {
            for(j=0;j<r; j++)
            {
                if(copytreeAdjMat[i][j]==1){
                    n++;
                    break;
                }
            }
        }

        vector<vector<int>> dmat(n, vector<int>(r));

        k=0;
        for(i=0; i<r; i++)
        {
            for(j=0; j<r; j++)
            {
                if(copytreeAdjMat[i][j]==1)
                {
                    for(f=0; f<r; f++)
                    {
                        dmat[k][f]=copytreeAdjMat[i][f];
                    }
                    k++;
                    break;
                }

            }
        }

        //correctness check
        for(j=0; j<r; j++)
        {
            for(i=0; i<n; i++)
            {
                assert(i<n);
                if(dmat[i][j]==1)
                {
                    continue;
                }
                if(dmat[i][j]==0 && j==n-1)
                {
                    printf("\nError in block 2 while searching for independent meshes\n");
                }
            }
        }

        // So far, we have constructed a spanning tree. Now let focus on finding cycle bases
        /*BLOCK 3*/
        f=0;
        for(i=0;i<n; i++)
            for(j=0;j<r; j++)
                if(dmat[i][j]==1)
                    for(k=0; k<r; k++) /*I'm going to see if I find a side that joins the cords in the j-th column of a*/
                        if(adjMatrix[k][j]==1 && dmat[i][k]==0 && f==0) {
                            /*printf("k=%d\tj=%d\n", k, j);*/
                            adjMatrix[k][j]=1;
                            adjMatrix[j][k]=1;
                            f=1;       /*I have to add only one side!*/
                        }

        for(i=0; i<r; i++)
        {
            vector<int> &treeAdjMat_i = treeAdjMat[i];
            vector<bool> &adjMatrix_i = adjMatrix[i];

            //int n_differences = 0;
            assert(static_cast<size_t>(r)==treeAdjMat_i.size());
            *m += countDifference(treeAdjMat_i,adjMatrix_i);
        }
        int &count = *m;
        count /= 2;
        //count how many sides have to be eliminated to obtain the tree graph = number of independent links
        c = r*count + count + 1;
        vector<vector<int>> indm(r);
        for (int i = 0; i<r; ++i)
        {
            indm[i].resize(c);
        }

        for (j = 0; j < c-r; j = j+r+1)
            for (i = 0; i < r; i++)
                indm[i][j] = -4;
        for (i = 0; i < r; i++)
            indm[i][c-1]=-5;
        for (k = 1; k < c; k=k+r+1)
            for(i = 0; i < r; i++)
                for(j = 0; j < r; j++)
                    indm[i][j+k] = treeAdjMat[i][j];
        // add the sides at a time
        k = 1;
        for(i = 0; i < r; i++)
            for(j = i+1; j<r; j++)
                if(adjMatrix[i][j]==1 && treeAdjMat[i][j]==0)
                {
                    indm[i][j+k]=1;
                    indm[j][i+k]=1;
                    k = k + r + 1;
                }
        /*I remove the segments that are outside the loop (see drawing)*/
        nu = 0; /*nu is the number one on a line*/
        done=0;
        for(k=1; k<c; k=k+r+1){
            while(done==0){
                done=1;
                for(i=0; i<r; i++){
                    for(j=0; j<r; j++)
                    {
                        /*Count how many ones are on a line*/
                        if(indm[i][j+k]==1)
                        {
                            nu++;
                        }
                    }
                    if(nu==1)
                    {
                        /*if there is only one,  make it null*/
                        for(j=0; j<r; j++)    /*I am in the j of 1*/
                        {
                            if(indm[i][j+k]==1){
                                indm[i][j+k]=0;
                                indm[j][i+k]=0;
                                done=0;
                            }
                        }
                    }
                    nu=0;
                }
            }
            done=0;
        }
        return indm;
    }